

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O1

string * __thiscall
pbrt::ColorEncodingHandle::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ColorEncodingHandle *this)

{
  ulong uVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  size_type __dnew;
  size_type local_18;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          ).bits;
  if ((GammaColorEncoding *)(uVar1 & 0xffffffffffff) == (GammaColorEncoding *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(nullptr)","")
    ;
  }
  else {
    if (uVar1 >> 0x31 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      local_18 = 0x17;
      pcVar2 = (char *)std::__cxx11::string::_M_create
                                 ((ulong *)__return_storage_ptr__,(ulong)&local_18);
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_18;
      builtin_strncpy(pcVar2 + 0xf,"coding ]",8);
      uVar3._0_1_ = '[';
      uVar3._1_1_ = ' ';
      uVar3._2_1_ = 'L';
      uVar3._3_1_ = 'i';
      uVar3._4_1_ = 'n';
      uVar3._5_1_ = 'e';
      uVar3._6_1_ = 'a';
      uVar3._7_1_ = 'r';
      uVar4._0_1_ = 'C';
      uVar4._1_1_ = 'o';
      uVar4._2_1_ = 'l';
      uVar4._3_1_ = 'o';
      uVar4._4_1_ = 'r';
      uVar4._5_1_ = 'E';
      uVar4._6_1_ = 'n';
      uVar4._7_1_ = 'c';
    }
    else {
      if ((uVar1 & 0xffff000000000000) != 0x2000000000000) {
        GammaColorEncoding::ToString_abi_cxx11_
                  (__return_storage_ptr__,(GammaColorEncoding *)(uVar1 & 0xffffffffffff));
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      local_18 = 0x15;
      pcVar2 = (char *)std::__cxx11::string::_M_create
                                 ((ulong *)__return_storage_ptr__,(ulong)&local_18);
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_18;
      builtin_strncpy(pcVar2 + 0xd,"coding ]",8);
      uVar3._0_1_ = '[';
      uVar3._1_1_ = ' ';
      uVar3._2_1_ = 's';
      uVar3._3_1_ = 'R';
      uVar3._4_1_ = 'G';
      uVar3._5_1_ = 'B';
      uVar3._6_1_ = 'C';
      uVar3._7_1_ = 'o';
      uVar4._0_1_ = 'l';
      uVar4._1_1_ = 'o';
      uVar4._2_1_ = 'r';
      uVar4._3_1_ = 'E';
      uVar4._4_1_ = 'n';
      uVar4._5_1_ = 'c';
      uVar4._6_1_ = 'o';
      uVar4._7_1_ = 'd';
    }
    *(undefined8 *)pcVar2 = uVar3;
    *(undefined8 *)(pcVar2 + 8) = uVar4;
    __return_storage_ptr__->_M_string_length = local_18;
    (__return_storage_ptr__->_M_dataplus)._M_p[local_18] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ColorEncodingHandle::ToString() const {
    if (!ptr())
        return "(nullptr)";

    auto ts = [&](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(ts);
}